

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O2

AttributeCell __thiscall nesvis::PpuHelper::get_attribute_cell(PpuHelper *this,int x,int y)

{
  uint uVar1;
  IMmu *pIVar2;
  uint uVar3;
  
  uVar3 = x / 4 + (y / 4) * 8 + 0x23c0;
  pIVar2 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
  uVar1 = (*pIVar2->_vptr_IMmu[3])(pIVar2,(ulong)uVar3 & 0xffff);
  return (AttributeCell)
         ((uint6)(uVar1 & 0xff) |
         (uint6)(((uVar1 & 0xff) >> ((char)(x / 2) * '\x02' & 2U) + ((byte)(y / 2) & 1) * '\x04' & 3
                 ) << 0x10) | (uint6)uVar3 << 0x20);
}

Assistant:

PpuHelper::AttributeCell PpuHelper::get_attribute_cell(int x, int y) {
    // TODO(jn) handle mirroring, this will not work
    // Each attribute cell has 4 tiles in it
    const int attribute_x = x / 4;
    const int attribute_y = y / 4;
    const uint16_t address = 0x23C0 + attribute_y * 8 + attribute_x;
    const uint8_t attribute_raw = nes_->ppu_mmu().read_byte(address);

    // Each attribute byte controls 2 tiles
    // Unpack: value = (bottomright << 6) | (bottomleft << 4) |
    //                 (topright << 2)    | (topleft << 0)
    const int x2 = x / 2;
    const int y2 = y / 2;
    const uint8_t shift = 2u * (x2 % 2u) + 4u * (y2 % 2u);
    const uint8_t attr_shifted = attribute_raw >> shift;
    const uint8_t palette = attr_shifted & 0b11u;

    return {.attribute = attribute_raw, .palette = palette, .address = address};
}